

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Parser::location_contents(Parser *this,Location *loc)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  ulong *in_RSI;
  long in_RDI;
  ro_substr rVar4;
  csubstr cVar5;
  char msg [39];
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  Location *in_stack_ffffffffffffff20;
  undefined4 uStack_88;
  undefined4 uStack_84;
  char *local_80;
  undefined1 local_78 [40];
  ulong *local_50;
  char *local_30;
  undefined4 local_28;
  ulong local_20;
  long local_18;
  
  local_50 = in_RSI;
  if (*(ulong *)(in_RDI + 0x20) <= *in_RSI) {
    memcpy(local_78,"check failed: (loc.offset < m_buf.len)",0x27);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    (*pcVar1)(local_78,0x27,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_ffffffffffffff10 = uStack_88;
    in_stack_ffffffffffffff14 = uStack_84;
    in_stack_ffffffffffffff18 = local_80;
  }
  local_18 = in_RDI + 0x18;
  local_20 = *local_50;
  if (*(ulong *)(in_RDI + 0x20) < local_20) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x1533;
    handle_error(0x347f4b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  rVar4 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x322839);
  cVar5.str = rVar4.str;
  cVar5.len = rVar4.len;
  return cVar5;
}

Assistant:

csubstr Parser::location_contents(Location const& loc) const
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, loc.offset < m_buf.len);
    return m_buf.sub(loc.offset);
}